

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

char * GetRunnerCommand(char *runnerExe,char *labExe)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int testRunnerSize;
  char *labExe_local;
  char *runnerExe_local;
  
  sVar3 = GetMemoryLimit();
  uVar1 = GetTimeout();
  iVar2 = snprintf(GetRunnerCommand::runnerCommand,0x1000,"%s -m %zu -t %d -e %s",runnerExe,
                   sVar3 + 0x3ff >> 10,(ulong)uVar1,labExe);
  if (iVar2 < 0) {
    PrintWithoutBuffering("\nInternal error: snprintf returned negative value\n");
    runnerExe_local = (char *)0x0;
  }
  else if (iVar2 == 0xfff) {
    PrintWithoutBuffering("\nInternal error: snprintf stopped at the end of buffer\n");
    runnerExe_local = (char *)0x0;
  }
  else {
    runnerExe_local = GetRunnerCommand::runnerCommand;
  }
  return runnerExe_local;
}

Assistant:

static const char* GetRunnerCommand(const char* runnerExe, char* labExe) {
    static char runnerCommand[4096] = {0};
    int testRunnerSize = snprintf(
        runnerCommand, sizeof(runnerCommand), "%s -m %zu -t %d -e %s",
        runnerExe, (GetMemoryLimit() + 1023) / 1024, GetTimeout(), labExe);
    if (testRunnerSize < 0) {
        PrintWithoutBuffering("\nInternal error: snprintf returned negative value\n");
        return NULL;
    }
    if (testRunnerSize == sizeof(runnerCommand) - 1) {
        PrintWithoutBuffering("\nInternal error: snprintf stopped at the end of buffer\n");
        return NULL;
    }
    return runnerCommand;
}